

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteMacOSXContentBuild
          (cmGlobalNinjaGenerator *this,string *input,string *output)

{
  cmNinjaBuild build;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [112];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_b8 [152];
  
  AddMacOSXContentRule(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"COPY_OSX_CONTENT",&local_149);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_128 + 0x40)
             ,output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_b8,input);
  WriteBuild(this,(ostream *)
                  (this->BuildFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
             (cmNinjaBuild *)local_128,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_128);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteMacOSXContentBuild(std::string input,
                                                     std::string output)
{
  this->AddMacOSXContentRule();
  {
    cmNinjaBuild build("COPY_OSX_CONTENT");
    build.Outputs.push_back(std::move(output));
    build.ExplicitDeps.push_back(std::move(input));
    this->WriteBuild(*this->BuildFileStream, build);
  }
}